

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<float>::btAlignedObjectArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint newsize;
  float local_1c;
  
  this->m_ownsMemory = true;
  this->m_data = (float *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  local_1c = 0.0;
  resize(this,newsize,&local_1c);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}